

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O0

int dog_eat(monst *mtmp,obj *obj,int x,int y,boolean devour)

{
  undefined1 auVar1 [16];
  boolean bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  obj *poVar8;
  permonst *ppVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char *local_80;
  char *local_70;
  char *local_60;
  int local_40;
  boolean vampiric;
  int nutrit;
  boolean heal;
  boolean grow;
  boolean poly;
  edog *edog;
  boolean devour_local;
  int y_local;
  int x_local;
  obj *obj_local;
  monst *mtmp_local;
  
  bVar10 = true;
  if ((mtmp->data->mlet != '0') && (bVar10 = true, (mtmp->data->mflags2 & 0x100) == 0)) {
    bVar10 = mtmp->data == mons + 0x85;
  }
  if (*(uint *)((long)&mtmp[1].data + 4) < moves) {
    *(uint *)((long)&mtmp[1].data + 4) = moves;
  }
  local_40 = dog_nutrition(mtmp,obj);
  if (((obj->otyp == 0x10e) || (obj->otyp == 0x10f)) || (bVar11 = false, obj->otyp == 0x129)) {
    iVar4 = pm_to_cham(obj->corpsenm);
    bVar11 = iVar4 != 0;
  }
  if (((obj->otyp == 0x10e) || (obj->otyp == 0x10f)) || (bVar12 = false, obj->otyp == 0x129)) {
    bVar12 = obj->corpsenm == 0xec;
  }
  if (((obj->otyp == 0x10e) || (obj->otyp == 0x10f)) || (bVar13 = false, obj->otyp == 0x129)) {
    bVar13 = obj->corpsenm == 0x119;
  }
  if (devour != '\0') {
    if (1 < mtmp->meating) {
      mtmp->meating = mtmp->meating / 2;
    }
    if (1 < local_40) {
      local_40 = (local_40 * 3) / 4;
    }
  }
  if (bVar10) {
    mtmp->meating = (mtmp->meating + 4) / 5;
    local_40 = (local_40 + 4) / 5;
  }
  *(int *)((long)&mtmp[1].data + 4) = local_40 + *(int *)((long)&mtmp[1].data + 4);
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffdfffff;
  if (*(int *)&mtmp[1].minvent != 0) {
    mtmp->mhpmax = *(int *)&mtmp[1].minvent + mtmp->mhpmax;
    *(undefined4 *)&mtmp[1].minvent = 0;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) != 0) && (1 < mtmp->mfleetim)) {
    mtmp->mfleetim = mtmp->mfleetim / 2;
  }
  if (mtmp->mtame < '\x14') {
    mtmp->mtame = mtmp->mtame + '\x01';
  }
  if ((x != mtmp->mx) || (y != mtmp->my)) {
    newsym(x,y);
    newsym((int)mtmp->mx,(int)mtmp->my);
  }
  bVar2 = is_pool(level,x,y);
  if (((bVar2 == '\0') || (((byte)u._1052_1_ >> 1 & 1) != 0)) &&
     (((viz_array[y][x] & 2U) != 0 || ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)))) {
    if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
        (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)
         ))) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
      local_60 = noit_Monnam(mtmp);
    }
    else {
      local_60 = "It";
    }
    if (bVar10) {
      local_70 = "drains";
    }
    else {
      local_70 = "eats";
      if (devour != '\0') {
        local_70 = "devours";
      }
    }
    if (obj->oclass == '\a') {
      local_80 = singular(obj,doname);
    }
    else {
      local_80 = doname(obj);
    }
    pline("%s %s %s.",local_60,local_70,local_80);
  }
  iVar4 = dogfood(mtmp,obj);
  if ((iVar4 == 0) && (obj->invlet != '\0')) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(200),8);
    *(int *)((long)&mtmp[1].nmon + 4) =
         SUB164((auVar1 << 0x40 | ZEXT816(200)) /
                SEXT816((long)(((ulong)*(uint *)&mtmp[1].nmon + (ulong)moves) -
                              (ulong)*(uint *)&mtmp->field_0x74)),0) +
         *(int *)((long)&mtmp[1].nmon + 4);
  }
  if ((mtmp->data != mons + 0xd9) || ((*(uint *)&obj->field_0x4a >> 0xc & 1) == 0)) {
    if (bVar10) {
      _y_local = obj;
      if (1 < obj->quan) {
        if (obj->where == '\x03') {
          _y_local = splitobj(obj,(long)obj->quan + -1);
          freeinv(_y_local);
          iVar4 = inv_cnt();
          if ((iVar4 < 0x34) || (poVar8 = merge_choice(invent,_y_local), poVar8 != (obj *)0x0)) {
            _y_local = addinv(_y_local);
          }
          else {
            dropy(_y_local);
          }
        }
        else {
          splitobj(obj,1);
        }
      }
      _y_local->oeaten = ((uint)mons[_y_local->corpsenm].cnutrit << 2) / 5;
      *(uint *)&_y_local->field_0x4a = *(uint *)&_y_local->field_0x4a & 0xf7ffffff | 0x8000000;
    }
    else if (obj == uball) {
      unpunish();
      delobj(obj);
    }
    else if (obj == uchain) {
      unpunish();
    }
    else if ((obj->quan < 2) || (obj->oclass != '\a')) {
      delobj(obj);
    }
    else {
      obj->quan = obj->quan + -1;
      uVar5 = weight(obj);
      obj->owt = uVar5;
    }
    goto LAB_0019b7b7;
  }
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff;
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffefffff | 0x100000;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_0019b7b7;
      bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0019b57a;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
joined_r0x0019b57a:
    if (bVar3 == 0) goto LAB_0019b7b7;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && ((((byte)u._1052_1_ >> 5 & 1) == 0 && (flags.verbose != '\0')))))) {
    pcVar6 = Monnam(mtmp);
    pcVar7 = distant_name(obj,doname);
    pline("%s spits %s out in disgust!",pcVar6,pcVar7);
  }
LAB_0019b7b7:
  if (bVar11) {
    newcham(level,mtmp,(permonst *)0x0,'\0',viz_array[mtmp->my][mtmp->mx] & 2);
  }
  if (((bVar12) && ((int)(uint)mtmp->m_lev < mtmp->data->mlevel + 0xf)) &&
     (ppVar9 = grow_up(mtmp,(monst *)0x0), ppVar9 == (permonst *)0x0)) {
    mtmp_local._4_4_ = 2;
  }
  else {
    if (bVar13) {
      mtmp->mhp = mtmp->mhpmax;
    }
    mtmp_local._4_4_ = 1;
  }
  return mtmp_local._4_4_;
}

Assistant:

int dog_eat(struct monst *mtmp, struct obj *obj, int x, int y, boolean devour)
{
	struct edog *edog = EDOG(mtmp);
	boolean poly = FALSE, grow = FALSE, heal = FALSE;
	int nutrit;
	boolean vampiric = is_vampiric(mtmp->data);

	if (edog->hungrytime < moves)
	    edog->hungrytime = moves;
	nutrit = dog_nutrition(mtmp, obj);
	poly = polyfodder(obj);
	grow = mlevelgain(obj);
	heal = mhealup(obj);
	if (devour) {
	    if (mtmp->meating > 1) mtmp->meating /= 2;
	    if (nutrit > 1) nutrit = (nutrit * 3) / 4;
	}

	/* vampires only get 1/5 normal nutrition */
	if (vampiric) {
	    mtmp->meating = (mtmp->meating + 4) / 5;
	    nutrit = (nutrit + 4) / 5;
	}

	edog->hungrytime += nutrit;
	mtmp->mconf = 0;
	if (edog->mhpmax_penalty) {
	    /* no longer starving */
	    mtmp->mhpmax += edog->mhpmax_penalty;
	    edog->mhpmax_penalty = 0;
	}
	if (mtmp->mflee && mtmp->mfleetim > 1) mtmp->mfleetim /= 2;
	if (mtmp->mtame < 20) mtmp->mtame++;
	if (x != mtmp->mx || y != mtmp->my) {	/* moved & ate on same turn */
	    newsym(x, y);
	    newsym(mtmp->mx, mtmp->my);
	}
	if (is_pool(level, x, y) && !Underwater) {
	    /* Don't print obj */
	    /* TODO: Reveal presence of sea monster (especially sharks) */
	} else
	/* hack: observe the action if either new or old location is in view */
	/* However, invisible monsters should still be "it" even though out of
	   sight locations should not. */
	if (cansee(x, y) || cansee(mtmp->mx, mtmp->my))
	    pline("%s %s %s.", mon_visible(mtmp) ? noit_Monnam(mtmp) : "It",
		  vampiric ? "drains" : devour ? "devours" : "eats",
		  (obj->oclass == FOOD_CLASS) ?
			singular(obj, doname) : doname(obj));
	/* It's a reward if it's DOGFOOD and the player dropped/threw it. */
	/* We know the player had it if invlet is set -dlc */
	if (dogfood(mtmp,obj) == DOGFOOD && obj->invlet)
	    edog->apport += (int)(200L/
		((long)edog->dropdist + moves - edog->droptime));

	if (mtmp->data == &mons[PM_RUST_MONSTER] && obj->oerodeproof) {
	    /* The object's rustproofing is gone now */
	    obj->oerodeproof = 0;
	    mtmp->mstun = 1;
	    if (canseemon(level, mtmp) && flags.verbose) {
		pline("%s spits %s out in disgust!",
		      Monnam(mtmp), distant_name(obj,doname));
	    }
	} else if (vampiric) {
	    /* split object */
	    if (obj->quan > 1L) {
		if (!carried(obj)) {
		    splitobj(obj, 1L);
		} else  {
		    /* carried */
		    obj = splitobj(obj, obj->quan - 1L);

		    freeinv(obj);
		    if (inv_cnt() >= 52 && !merge_choice(invent, obj))
			dropy(obj);
		    else
			obj = addinv(obj);	/* unlikely but a merge is possible */
		}
	    }

	    /* take away blood nutrition */
	    obj->oeaten = drainlevel(obj);
	    obj->odrained = 1;
	} else if (obj == uball) {
	    unpunish();
	    delobj(obj);
	} else if (obj == uchain)
	    unpunish();
	else if (obj->quan > 1L && obj->oclass == FOOD_CLASS) {
	    obj->quan--;
	    obj->owt = weight(obj);
	} else
	    delobj(obj);

	if (poly) {
	    newcham(level, mtmp, NULL, FALSE,
			   cansee(mtmp->mx, mtmp->my));
	}
	/* limit "instant" growth to prevent potential abuse */
	if (grow && (int) mtmp->m_lev < (int)mtmp->data->mlevel + 15) {
	    if (!grow_up(mtmp, NULL)) return 2;
	}
	if (heal) mtmp->mhp = mtmp->mhpmax;
	return 1;
}